

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

double gamma(double param_1)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (0.0 <= param_1) {
    dVar5 = 1.0;
    bVar1 = true;
LAB_001365f1:
    if (2.22e-16 <= param_1) {
      if (12.0 <= param_1) {
        if (171.624 < param_1) goto LAB_00136654;
        dVar6 = 0.0057083835261;
        for (lVar4 = 0; lVar4 != 0x30; lVar4 = lVar4 + 8) {
          dVar6 = dVar6 / (param_1 * param_1) + *(double *)((long)&DAT_001504e0 + lVar4);
        }
        dVar7 = log(param_1);
        dVar6 = exp(dVar7 * (param_1 + -0.5) + (dVar6 / param_1 - param_1) + 0.9189385332046728);
      }
      else {
        dVar6 = 1.0;
        if (1.0 <= param_1) {
          iVar2 = (int)param_1 + -1;
          dVar9 = param_1 - (double)iVar2;
          dVar7 = dVar9 + -1.0;
        }
        else {
          dVar9 = param_1 + 1.0;
          iVar2 = 0;
          dVar7 = param_1;
        }
        dVar8 = 0.0;
        for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
          dVar8 = (dVar8 + *(double *)((long)&DAT_001502e0 + lVar4)) * dVar7;
          dVar6 = dVar6 * dVar7 + *(double *)((long)&DAT_00150320 + lVar4);
        }
        dVar6 = dVar8 / dVar6 + 1.0;
        if (param_1 < dVar9) goto LAB_001366c3;
        if (dVar9 < param_1) {
          iVar3 = 0;
          if (0 < iVar2) {
            iVar3 = iVar2;
          }
          while (iVar3 != 0) {
            dVar6 = dVar6 * dVar9;
            dVar9 = dVar9 + 1.0;
            iVar3 = iVar3 + -1;
          }
        }
      }
    }
    else {
      if (param_1 < 1.79e-308) goto LAB_00136654;
      dVar6 = 1.0;
LAB_001366c3:
      dVar6 = dVar6 / param_1;
    }
    if (!bVar1) {
      dVar6 = -dVar6;
    }
    dVar5 = (double)(-(ulong)(dVar5 != 1.0) & (ulong)(dVar5 / dVar6) |
                    ~-(ulong)(dVar5 != 1.0) & (ulong)dVar6);
  }
  else {
    dVar5 = floor(-param_1);
    dVar6 = -param_1 - dVar5;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      dVar7 = floor(dVar5 * 0.5);
      bVar1 = dVar7 + dVar7 == dVar5;
      dVar5 = sin(dVar6 * 3.141592653589793);
      dVar5 = -3.141592653589793 / dVar5;
      param_1 = 1.0 - param_1;
      goto LAB_001365f1;
    }
LAB_00136654:
    dVar5 = 1.79e+308;
  }
  return dVar5;
}

Assistant:

double gamma(double x) {
	/*
	 * This C program code is based on  W J Cody's fortran code.
	 * http://www.netlib.org/specfun/gamma
	 * 
	 * References:
   "An Overview of Software Development for Special Functions",
	W. J. Cody, Lecture Notes in Mathematics, 506,
	Numerical Analysis Dundee, 1975, G. A. Watson (ed.),
	Springer Verlag, Berlin, 1976.

   Computer Approximations, Hart, Et. Al., Wiley and sons, New York, 1968.
   */ 
   
	// numerator and denominator coefficients for 1 <= x <= 2
	
	double y,oup,fact,sum,y2,yi,z,nsum,dsum;
	int swi,n,i;
	
	double spi = 0.9189385332046727417803297;
    double pi  = 3.1415926535897932384626434;
	double xmax = 171.624e+0;
	double xinf = 1.79e308;
	double eps = 2.22e-16;
	double xninf = 1.79e-308;
	
	double num[8] = { -1.71618513886549492533811e+0,
                        2.47656508055759199108314e+1,
                       -3.79804256470945635097577e+2,
                        6.29331155312818442661052e+2,
                        8.66966202790413211295064e+2,
                       -3.14512729688483675254357e+4,
                       -3.61444134186911729807069e+4,
                        6.64561438202405440627855e+4 };
                       
    double den[8] = { -3.08402300119738975254353e+1,
                        3.15350626979604161529144e+2,
                       -1.01515636749021914166146e+3,
                       -3.10777167157231109440444e+3,
                        2.25381184209801510330112e+4,
                        4.75584627752788110767815e+3,
                       -1.34659959864969306392456e+5,
                       -1.15132259675553483497211e+5 }; 
                       
    // Coefficients for Hart's Minimax approximation x >= 12       
    
    
	double c[7] = { -1.910444077728e-03,
                        8.4171387781295e-04,
                       -5.952379913043012e-04,
                        7.93650793500350248e-04,
                       -2.777777777777681622553e-03,
                        8.333333333333333331554247e-02,
                        5.7083835261e-03 };            
    
    y = x;             
    swi = 0; 
    fact = 1.0;
    n = 0;      
    
    
    if ( y < 0.) {
		// Negative x
		y = -x;
		yi = fix(y);
		oup = y - yi;
		
		if (oup != 0.0) {
			if (yi != fix(yi * .5) * 2.) {
				swi = 1;
			}
			fact = -pi / sin(pi * oup);
			y += 1.;
		} else {
			return xinf;
		}
	}      
	
	if (y < eps) {
		if (y >= xninf) {
			oup = 1.0/y;
		} else {
			return xinf;
		}
		
	} else if (y < 12.) {
		yi = y;
		if ( y < 1.) {
			z = y;
			y += 1.;
		} else {
			n = ( int ) y - 1;
            y -= ( double ) n;
            z = y - 1.0;
		}
		nsum = 0.;
		dsum = 1.;
		for (i = 0; i < 8; ++i) {
			nsum = (nsum + num[i]) * z;
			dsum = dsum * z + den[i];
		}
		oup = nsum / dsum + 1.;
		
		if (yi < y) {
	   
			oup /= yi;
		} else if (yi > y) {
	    
			for (i = 0; i < n; ++i) {
				oup *= y;
				y += 1.;
			}
		
		}      
	
	} else {
		if (y <= xmax) {
			y2 = y * y;
			sum = c[6];
			for (i = 0; i < 6; ++i) {
				sum = sum / y2 + c[i];
			}
			sum = sum / y - y + spi;
			sum += (y - .5) * log(y);
			oup = exp(sum);
		} else {
			return(xinf);
		}
	}
	
	if (swi) {
		oup = -oup;
	}
    if (fact != 1.) {
		oup = fact / oup; 
	}       
	
	return oup;
}